

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall
TC_parser<true>::parserWarning
          (TC_parser<true> *this,char *message,char *begin,char *pos,char *message2)

{
  ostream *poVar1;
  char *pcVar2;
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  allocator<char> *in_stack_ffffffffffffff08;
  char *__beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 local_81 [56];
  allocator local_49;
  string local_48 [32];
  char *local_28;
  long local_20;
  char *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_18,local_20 - (long)local_18,&local_49);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"in Example #");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI[10] + 0x230));
  poVar1 = std::operator<<(poVar1,": \"");
  pcVar2 = (char *)*in_RDI;
  __beg = (char *)in_RDI[2];
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>(this_00,__beg,pcVar2,in_stack_ffffffffffffff08);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

inline void parserWarning(const char* message, char* begin, char* pos, const char* message2)
  {
    cerr << message << std::string(begin, pos - begin).c_str() << message2 << "in Example #"
         << this->p->end_parsed_examples << ": \"" << std::string(this->beginLine, this->endLine).c_str() << "\""
         << endl;
  }